

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_engines.cc
# Opt level: O1

tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *
generate_list<trng::yarn4>
          (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_>
           *__return_storage_ptr__,yarn4 *r1,yarn4 *r2,long N,long skip1,long skip2)

{
  int iVar1;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>> *p_Var2
  ;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  long lVar13;
  vector<int,_std::allocator<int>_> v2;
  vector<int,_std::allocator<int>_> v1;
  uint local_ac;
  yarn4 *local_a8;
  yarn4 *local_a0;
  vector<int,_std::allocator<int>_> local_98;
  vector<int,_std::allocator<int>_> local_78;
  long local_58;
  long local_50;
  long local_48;
  _Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
  *local_40;
  long local_38;
  
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (int *)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (int *)0x0;
  local_a8 = r2;
  local_a0 = r1;
  local_58 = skip1;
  local_50 = skip2;
  local_40 = (_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>
              *)__return_storage_ptr__;
  local_38 = N;
  if (0 < N) {
    std::vector<int,_std::allocator<int>_>::reserve(&local_78,N);
    std::vector<int,_std::allocator<int>_>::reserve(&local_98,N);
    lVar9 = 0;
    do {
      lVar13 = lVar9;
      iVar10 = (local_a0->S).r[0];
      iVar1 = (local_a0->S).r[1];
      iVar12 = (local_a0->S).r[2];
      uVar7 = (long)(local_a0->S).r[3] * (long)(local_a0->P).a[3] +
              (long)(local_a0->P).a[2] * (long)iVar12 +
              (long)(local_a0->P).a[1] * (long)iVar1 + (long)(local_a0->P).a[0] * (long)iVar10;
      (local_a0->S).r[3] = iVar12;
      (local_a0->S).r[2] = iVar1;
      uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
      uVar7 = uVar8 - 0x1fffffffc;
      if (uVar8 < 0x1fffffffc) {
        uVar7 = uVar8;
      }
      uVar8 = uVar7 - 0xfffffffe;
      if (uVar7 < 0xfffffffe) {
        uVar8 = uVar7;
      }
      uVar6 = (uint)uVar8 + 0x80000001;
      if (uVar8 < 0x7fffffff) {
        uVar6 = (uint)uVar8;
      }
      (local_a0->S).r[1] = iVar10;
      (local_a0->S).r[0] = uVar6;
      local_ac = 0;
      if (uVar6 != 0) {
        uVar3 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar6 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar6 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar10 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar6 & 0xffff) * 4) *
                       (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar6 >> 0x10) * 4 + 0x40000)
                      >> 0x1f);
        uVar6 = uVar3 + iVar10;
        local_ac = uVar3 + 0x80000001 + iVar10;
        if (uVar6 < 0x7fffffff) {
          local_ac = uVar6;
        }
      }
      if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_78,
                   (iterator)
                   local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_ac);
      }
      else {
        *local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_ac;
        local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      iVar10 = (local_a8->S).r[0];
      iVar1 = (local_a8->S).r[1];
      iVar12 = (local_a8->S).r[2];
      uVar7 = (long)(local_a8->S).r[3] * (long)(local_a8->P).a[3] +
              (long)(local_a8->P).a[2] * (long)iVar12 +
              (long)(local_a8->P).a[1] * (long)iVar1 + (long)(local_a8->P).a[0] * (long)iVar10;
      (local_a8->S).r[3] = iVar12;
      uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
      uVar7 = uVar8 - 0x1fffffffc;
      if (uVar8 < 0x1fffffffc) {
        uVar7 = uVar8;
      }
      uVar8 = uVar7 - 0xfffffffe;
      if (uVar7 < 0xfffffffe) {
        uVar8 = uVar7;
      }
      (local_a8->S).r[2] = iVar1;
      (local_a8->S).r[1] = iVar10;
      uVar6 = (uint)uVar8 + 0x80000001;
      if (uVar8 < 0x7fffffff) {
        uVar6 = (uint)uVar8;
      }
      (local_a8->S).r[0] = uVar6;
      if (uVar6 == 0) {
        local_ac = 0;
      }
      else {
        uVar3 = (uint)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar6 & 0xffff) * 4) *
                      (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar6 >> 0x10) * 4 + 0x40000)) &
                0x7fffffff;
        iVar10 = (int)((ulong)*(uint *)(trng::yarn4::g + (ulong)(uVar6 & 0xffff) * 4) *
                       (ulong)*(uint *)(trng::yarn4::g + (long)((int)uVar6 >> 0x10) * 4 + 0x40000)
                      >> 0x1f);
        uVar6 = uVar3 + iVar10;
        local_ac = uVar3 + 0x80000001 + iVar10;
        if (uVar6 < 0x7fffffff) {
          local_ac = uVar6;
        }
      }
      if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_finish ==
          local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                  (&local_98,
                   (iterator)
                   local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_finish,(int *)&local_ac);
      }
      else {
        *local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish = local_ac;
        local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_finish = local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish + 1;
      }
      if (0 < local_58) {
        lVar9 = local_58;
        iVar10 = (local_a0->S).r[3];
        iVar1 = (local_a0->S).r[2];
        iVar12 = (local_a0->S).r[0];
        iVar11 = (local_a0->S).r[1];
        do {
          iVar5 = iVar11;
          iVar11 = iVar12;
          iVar4 = iVar1;
          uVar7 = (long)iVar10 * (long)(local_a0->P).a[3] + (long)iVar4 * (long)(local_a0->P).a[2] +
                  (long)iVar5 * (long)(local_a0->P).a[1] + (long)iVar11 * (long)(local_a0->P).a[0];
          uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
          uVar7 = uVar8 - 0x1fffffffc;
          if (uVar8 < 0x1fffffffc) {
            uVar7 = uVar8;
          }
          uVar8 = uVar7 - 0xfffffffe;
          if (uVar7 < 0xfffffffe) {
            uVar8 = uVar7;
          }
          iVar12 = (int)uVar8 + -0x7fffffff;
          if (uVar8 < 0x7fffffff) {
            iVar12 = (int)uVar8;
          }
          lVar9 = lVar9 + -1;
          iVar10 = iVar4;
          iVar1 = iVar5;
        } while (lVar9 != 0);
        (local_a0->S).r[3] = iVar4;
        (local_a0->S).r[2] = iVar5;
        (local_a0->S).r[1] = iVar11;
        (local_a0->S).r[0] = iVar12;
      }
      if (0 < local_50) {
        lVar9 = local_50;
        iVar10 = (local_a8->S).r[3];
        iVar1 = (local_a8->S).r[2];
        iVar12 = (local_a8->S).r[0];
        iVar11 = (local_a8->S).r[1];
        do {
          iVar5 = iVar11;
          iVar11 = iVar12;
          iVar4 = iVar1;
          uVar7 = (long)iVar10 * (long)(local_a8->P).a[3] + (long)iVar4 * (long)(local_a8->P).a[2] +
                  (long)iVar5 * (long)(local_a8->P).a[1] + (long)iVar11 * (long)(local_a8->P).a[0];
          uVar8 = (uVar7 >> 0x1f) + (uVar7 & 0x7fffffff);
          uVar7 = uVar8 - 0x1fffffffc;
          if (uVar8 < 0x1fffffffc) {
            uVar7 = uVar8;
          }
          uVar8 = uVar7 - 0xfffffffe;
          if (uVar7 < 0xfffffffe) {
            uVar8 = uVar7;
          }
          iVar12 = (int)uVar8 + -0x7fffffff;
          if (uVar8 < 0x7fffffff) {
            iVar12 = (int)uVar8;
          }
          lVar9 = lVar9 + -1;
          iVar10 = iVar4;
          iVar1 = iVar5;
        } while (lVar9 != 0);
        (local_a8->S).r[3] = iVar4;
        (local_a8->S).r[2] = iVar5;
        (local_a8->S).r[1] = iVar11;
        (local_a8->S).r[0] = iVar12;
      }
      lVar9 = lVar13 + 1;
      local_48 = lVar13;
    } while (lVar13 + 1 != local_38);
  }
  p_Var2 = local_40;
  std::_Tuple_impl<0ul,std::vector<int,std::allocator<int>>,std::vector<int,std::allocator<int>>>::
  _Tuple_impl<std::vector<int,std::allocator<int>>&,std::vector<int,std::allocator<int>>&,void>
            (local_40,&local_78,&local_98);
  if (local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_78.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return (tuple<std::vector<int,_std::allocator<int>_>,_std::vector<int,_std::allocator<int>_>_> *)
         p_Var2;
}

Assistant:

std::tuple<std::vector<typename R::result_type>, std::vector<typename R::result_type>>
generate_list(R &r1, R &r2, const long N, const long skip1, const long skip2) {
  std::vector<typename R::result_type> v1, v2;
  if (N > 0) {
    v1.reserve(N);
    v2.reserve(N);
  }
  for (long i{0}; i < N; ++i) {
    v1.push_back(r1());
    v2.push_back(r2());
    for (long j{0}; j < skip1; ++j)
      r1();
    for (long j{0}; j < skip2; ++j)
      r2();
  }
  return {v1, v2};
}